

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O2

void borg_note_internal(_Bool warning,char *what)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ushort **ppuVar4;
  short sVar5;
  ulong uVar6;
  undefined7 in_register_00000039;
  long lVar7;
  int iVar8;
  term *t;
  ulong uVar9;
  wchar_t local_454;
  wchar_t h;
  wchar_t w;
  term *local_448;
  wchar_t x;
  char buf [1024];
  
  t = Term;
  if ((int)CONCAT71(in_register_00000039,warning) == 0) {
    message_add(what,0);
  }
  else {
    msg("%s",what);
  }
  pcVar2 = strstr(what,"Best Combo");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr(what,"Taking off ");
    if (pcVar2 == (char *)0x0) goto LAB_002154cb;
  }
  sVar5 = borg.time_this_panel + 10;
  borg.time_this_panel = sVar5;
  pcVar2 = format("# Anti-loop variable tick (%d).",(ulong)(uint)(int)sVar5);
  borg_note(pcVar2);
LAB_002154cb:
  local_448 = t;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    if ((angband_term[lVar7] != (term *)0x0) &&
       ((*(byte *)((long)window_flag + lVar7 * 4 + 1) & 0x40) != 0)) {
      Term_activate(angband_term[lVar7]);
      Term_get_size(&w,&h);
      Term_locate(&x,&local_454);
      Term_erase(L'\0',local_454,L'ÿ');
      sVar3 = strlen(what);
      if (w + L'\xfffffffe' < (int)sVar3) {
        while( true ) {
          uVar1 = w + L'\xfffffffe';
          uVar6 = (ulong)uVar1;
          if ((int)sVar3 <= (int)uVar1) break;
          for (uVar9 = (ulong)(w / 2); (long)uVar9 < (long)(int)uVar1; uVar9 = uVar9 + 1) {
            ppuVar4 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar4 + (long)what[uVar9] * 2 + 1) & 0x20) != 0) {
              uVar6 = uVar9 & 0xffffffff;
            }
          }
          iVar8 = (int)uVar6;
          uVar9 = 0;
          if (0 < iVar8) {
            uVar9 = uVar6;
          }
          for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
            buf[uVar6] = what[uVar6];
          }
          (buf + uVar9)[0] = '\\';
          (buf + uVar9)[1] = '\0';
          Term_addstr(L'\xffffffff',L'\x01',buf);
          local_454 = local_454 + L'\x01';
          if (h <= local_454) {
            local_454 = L'\0';
          }
          Term_erase(L'\0',local_454,L'ÿ');
          what = what + iVar8;
          sVar3 = (size_t)(uint)((int)sVar3 - iVar8);
        }
        Term_addstr(L'\xffffffff',L'\x01',what);
        local_454 = local_454 + L'\x01';
        if (h <= local_454) {
          local_454 = L'\0';
        }
        Term_erase(L'\0',local_454,L'ÿ');
        t = local_448;
      }
      else {
        Term_addstr(L'\xffffffff',L'\x01',what);
        local_454 = local_454 + L'\x01';
        if (h <= local_454) {
          local_454 = L'\0';
        }
        Term_erase(L'\0',local_454,L'ÿ');
      }
      Term_fresh();
      Term_activate(t);
    }
  }
  return;
}

Assistant:

static void borg_note_internal(bool warning, const char *what)
{
    int j, n, i, k;

    int w, h, x, y;

    term *old = Term;

    /* Memorize it */
    if (warning) {
        msg("%s", what);
    } else {
        message_add(what, MSG_GENERIC);
    }

    /* Log the message */
    borg_info(what);

    /* Mega-Hack -- Check against the swap loops */
    if (strstr(what, "Best Combo") || strstr(what, "Taking off ")) {
        /* Tick the anti loop clock */
        borg.time_this_panel += 10;
        borg_note(
            format("# Anti-loop variable tick (%d).", borg.time_this_panel));
    }

    /* Scan windows */
    for (j = 0; j < 8; j++) {
        if (!angband_term[j])
            continue;

        /* Check flag */
        if (!(window_flag[j] & PW_BORG_1))
            continue;

        /* Activate */
        Term_activate(angband_term[j]);

        /* Access size */
        Term_get_size(&w, &h);

        /* Access cursor */
        Term_locate(&x, &y);

        /* Erase current line */
        Term_erase(0, y, 255);

        /* Total length */
        n = strlen(what);

        /* Too long */
        if (n > w - 2) {
            char buf[1024];

            /* Split */
            while (n > w - 2) {
                /* Default */
                k = w - 2;

                /* Find a split point */
                for (i = w / 2; i < w - 2; i++) {
                    /* Pre-emptive split point */
                    if (isspace(what[i]))
                        k = i;
                }

                /* Copy over the split message */
                for (i = 0; i < k; i++) {
                    /* Copy */
                    buf[i] = what[i];
                }

                /* Indicate split */
                buf[i++] = '\\';

                /* Terminate */
                buf[i] = '\0';

                /* Show message */
                Term_addstr(-1, COLOUR_WHITE, buf);

                /* Advance (wrap) */
                if (++y >= h)
                    y = 0;

                /* Erase next line */
                Term_erase(0, y, 255);

                /* Advance */
                what += k;

                /* Reduce */
                n -= k;
            }

            /* Show message tail */
            Term_addstr(-1, COLOUR_WHITE, what);

            /* Advance (wrap) */
            if (++y >= h)
                y = 0;

            /* Erase next line */
            Term_erase(0, y, 255);
        }

        /* Normal */
        else {
            /* Show message */
            Term_addstr(-1, COLOUR_WHITE, what);

            /* Advance (wrap) */
            if (++y >= h)
                y = 0;

            /* Erase next line */
            Term_erase(0, y, 255);
        }

        /* Flush output */
        Term_fresh();

        /* Use correct window */
        Term_activate(old);
    }
}